

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw.cpp
# Opt level: O2

void ImGui_ImplGlfw_KeyCallback(GLFWwindow *window,int key,int scancode,int action,int mods)

{
  ImGuiIO *pIVar1;
  bool bVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined4 uVar5;
  undefined1 auVar6 [16];
  
  if (g_PrevUserCallbackKey != (GLFWkeyfun)0x0) {
    (*g_PrevUserCallbackKey)(window,key,scancode,action,mods);
  }
  pIVar1 = ImGui::GetIO();
  if (action == 1) {
    bVar2 = true;
  }
  else {
    if (action != 0) goto LAB_002244d9;
    bVar2 = false;
  }
  pIVar1->KeysDown[key] = bVar2;
LAB_002244d9:
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(pIVar1->KeysDown + 0x154);
  auVar6 = vpsllw_avx(auVar6,7);
  uVar3 = vpmovb2m_avx512vl(auVar6);
  uVar5 = *(undefined4 *)(pIVar1->KeysDown + 0x158);
  auVar6 = vpbroadcastb_avx512vl(ZEXT116(1));
  bVar2 = (bool)((byte)uVar3 & 1);
  auVar4[0] = bVar2 * auVar6[0] | !bVar2 * (char)uVar5;
  bVar2 = (bool)((byte)(uVar3 >> 1) & 1);
  auVar4[1] = bVar2 * auVar6[1] | !bVar2 * (char)((uint)uVar5 >> 8);
  bVar2 = (bool)((byte)(uVar3 >> 2) & 1);
  auVar4[2] = bVar2 * auVar6[2] | !bVar2 * (char)((uint)uVar5 >> 0x10);
  bVar2 = (bool)((byte)(uVar3 >> 3) & 1);
  auVar4[3] = bVar2 * auVar6[3] | !bVar2 * (char)((uint)uVar5 >> 0x18);
  auVar4[4] = ((byte)(uVar3 >> 4) & 1) * auVar6[4];
  auVar4[5] = ((byte)(uVar3 >> 5) & 1) * auVar6[5];
  auVar4[6] = ((byte)(uVar3 >> 6) & 1) * auVar6[6];
  auVar4[7] = ((byte)(uVar3 >> 7) & 1) * auVar6[7];
  auVar4[8] = ((byte)(uVar3 >> 8) & 1) * auVar6[8];
  auVar4[9] = ((byte)(uVar3 >> 9) & 1) * auVar6[9];
  auVar4[10] = ((byte)(uVar3 >> 10) & 1) * auVar6[10];
  auVar4[0xb] = ((byte)(uVar3 >> 0xb) & 1) * auVar6[0xb];
  auVar4[0xc] = ((byte)(uVar3 >> 0xc) & 1) * auVar6[0xc];
  auVar4[0xd] = ((byte)(uVar3 >> 0xd) & 1) * auVar6[0xd];
  auVar4[0xe] = ((byte)(uVar3 >> 0xe) & 1) * auVar6[0xe];
  auVar4[0xf] = ((byte)(uVar3 >> 0xf) & 1) * auVar6[0xf];
  auVar6 = vpshufb_avx(auVar4,_DAT_003e5d00);
  uVar5 = auVar6._0_4_;
  pIVar1->KeyCtrl = (bool)(char)uVar5;
  pIVar1->KeyShift = (bool)(char)((uint)uVar5 >> 8);
  pIVar1->KeyAlt = (bool)(char)((uint)uVar5 >> 0x10);
  pIVar1->KeySuper = (bool)(char)((uint)uVar5 >> 0x18);
  return;
}

Assistant:

void ImGui_ImplGlfw_KeyCallback(GLFWwindow* window, int key, int scancode, int action, int mods)
{
    if (g_PrevUserCallbackKey != NULL)
        g_PrevUserCallbackKey(window, key, scancode, action, mods);

    ImGuiIO& io = ImGui::GetIO();
    if (action == GLFW_PRESS)
        io.KeysDown[key] = true;
    if (action == GLFW_RELEASE)
        io.KeysDown[key] = false;

    // Modifiers are not reliable across systems
    io.KeyCtrl = io.KeysDown[GLFW_KEY_LEFT_CONTROL] || io.KeysDown[GLFW_KEY_RIGHT_CONTROL];
    io.KeyShift = io.KeysDown[GLFW_KEY_LEFT_SHIFT] || io.KeysDown[GLFW_KEY_RIGHT_SHIFT];
    io.KeyAlt = io.KeysDown[GLFW_KEY_LEFT_ALT] || io.KeysDown[GLFW_KEY_RIGHT_ALT];
#ifdef _WIN32
    io.KeySuper = false;
#else
    io.KeySuper = io.KeysDown[GLFW_KEY_LEFT_SUPER] || io.KeysDown[GLFW_KEY_RIGHT_SUPER];
#endif
}